

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start_stop_test.cpp
# Opt level: O2

int main(void)

{
  thread_pool pool;
  
  nonstd::thread_pool::thread_pool(&pool,0xe);
  nonstd::thread_pool::start();
  nonstd::thread_pool::stop();
  nonstd::thread_pool::~thread_pool(&pool);
  return 0;
}

Assistant:

int main()
{
   nonstd::thread_pool pool(14);
   pool.start();

   pool.stop();

   return 0;
}